

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getDerivatives
          (BeagleCPUImpl<float,_1,_0> *this,double *outSumFirstDerivative,
          double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  double *pdVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM2_Qb;
  
  *outSumFirstDerivative = 0.0;
  iVar3 = this->kPatternCount;
  lVar6 = (long)iVar3;
  if (lVar6 < 1) {
    if (outSumSecondDerivative != (double *)0x0) {
      *outSumSecondDerivative = 0.0;
    }
  }
  else {
    pdVar4 = this->gPatternWeights;
    pfVar5 = this->outFirstDerivativesTmp;
    auVar8 = ZEXT816(0) << 0x40;
    lVar7 = 0;
    do {
      auVar9._0_8_ = (double)pfVar5[lVar7];
      auVar9._8_8_ = in_XMM2_Qb;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar4[lVar7];
      auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar1);
      lVar7 = lVar7 + 1;
      *outSumFirstDerivative = auVar8._0_8_;
    } while (lVar6 != lVar7);
    if ((outSumSecondDerivative != (double *)0x0) && (*outSumSecondDerivative = 0.0, 0 < iVar3)) {
      pdVar4 = this->gPatternWeights;
      pfVar5 = this->outSecondDerivativesTmp;
      auVar8 = ZEXT816(0) << 0x20;
      lVar7 = 0;
      do {
        auVar10._0_8_ = (double)pfVar5[lVar7];
        auVar10._8_8_ = in_XMM2_Qb;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar4[lVar7];
        auVar8 = vfmadd231sd_fma(auVar8,auVar10,auVar2);
        lVar7 = lVar7 + 1;
        *outSumSecondDerivative = auVar8._0_8_;
      } while (lVar6 != lVar7);
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getDerivatives(double* outSumFirstDerivative,
                                                      double* outSumSecondDerivative) {

    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (outSumSecondDerivative != NULL) {
        *outSumSecondDerivative = 0.0;
        for (int i = 0; i < kPatternCount; i++) {
            *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }
    }

    return BEAGLE_SUCCESS;
}